

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

UVec4 __thiscall tcu::getFormatMaxUintValue(tcu *this,TextureFormat *format)

{
  TextureFormat *this_00;
  bool bVar1;
  byte bVar2;
  unsigned_short uVar3;
  uint s;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar4;
  UVec4 UVar5;
  bool local_29;
  TextureFormat local_28;
  TextureFormat local_20;
  TextureFormat *local_18;
  TextureFormat *format_local;
  
  local_18 = format;
  format_local = (TextureFormat *)this;
  TextureFormat::TextureFormat(&local_20,RGBA,UNSIGNED_INT_1010102_REV);
  bVar1 = TextureFormat::operator==(format,&local_20);
  this_00 = local_18;
  local_29 = true;
  if (!bVar1) {
    TextureFormat::TextureFormat(&local_28,BGRA,UNSIGNED_INT_1010102_REV);
    local_29 = TextureFormat::operator==(this_00,&local_28);
  }
  if (local_29 == false) {
    switch(local_18->type) {
    case UNSIGNED_INT8:
      bVar2 = std::numeric_limits<unsigned_char>::max();
      Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this,(uint)bVar2);
      uVar4 = extraout_RDX_00;
      break;
    case UNSIGNED_INT16:
      uVar3 = std::numeric_limits<unsigned_short>::max();
      Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this,(uint)uVar3);
      uVar4 = extraout_RDX_01;
      break;
    case UNSIGNED_INT24:
      Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this,0xffffff);
      uVar4 = extraout_RDX_02;
      break;
    case UNSIGNED_INT32:
      s = std::numeric_limits<unsigned_int>::max();
      Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this,s);
      uVar4 = extraout_RDX_03;
      break;
    default:
      Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this,0);
      uVar4 = extraout_RDX_04;
    }
  }
  else {
    Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this,0x3ff,0x3ff,0x3ff,3);
    uVar4 = extraout_RDX;
  }
  UVar5.m_data[2] = (int)uVar4;
  UVar5.m_data[3] = (int)((ulong)uVar4 >> 0x20);
  UVar5.m_data._0_8_ = this;
  return (UVec4)UVar5.m_data;
}

Assistant:

UVec4 getFormatMaxUintValue (const TextureFormat& format)
{
	DE_ASSERT(getTextureChannelClass(format.type) == TEXTURECHANNELCLASS_UNSIGNED_INTEGER);

	if (format == TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT_1010102_REV) ||
		format == TextureFormat(TextureFormat::BGRA, TextureFormat::UNSIGNED_INT_1010102_REV))
		return UVec4(1023u, 1023u, 1023u, 3u);

	switch (format.type)
	{
		case TextureFormat::UNSIGNED_INT8:	return UVec4(std::numeric_limits<deUint8>::max());
		case TextureFormat::UNSIGNED_INT16:	return UVec4(std::numeric_limits<deUint16>::max());
		case TextureFormat::UNSIGNED_INT24:	return UVec4(0xffffffu);
		case TextureFormat::UNSIGNED_INT32:	return UVec4(std::numeric_limits<deUint32>::max());

		default:
			DE_FATAL("Invalid channel type");
			return UVec4(0);
	}
}